

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfCwiseBinaryOp.h
# Opt level: O2

void Eigen::internal::
     assign_impl<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_2,_2>_>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_2,_2>_>,_0,_0,_0>
     ::run(SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,_2,_2>_>_>
           *dst,CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,_2,_2>_>
                *src)

{
  Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false> *pBVar1;
  PointerType pdVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  Index col;
  long lVar6;
  Index inner;
  long lVar7;
  long lVar8;
  
  pBVar1 = dst->m_matrix;
  lVar3 = (pBVar1->
          super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_0>.m_rows
          .m_value;
  lVar4 = (pBVar1->
          super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_0>.m_cols
          .m_value;
  lVar5 = 0;
  if (lVar3 < 1) {
    lVar3 = lVar5;
  }
  if (lVar4 < 1) {
    lVar4 = lVar5;
  }
  for (lVar6 = 0; lVar6 != lVar4; lVar6 = lVar6 + 1) {
    for (lVar7 = 0; lVar3 != lVar7; lVar7 = lVar7 + 1) {
      lVar8 = (pBVar1->
              super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>).
              super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.
              m_outerStride * lVar5;
      pdVar2 = (pBVar1->
               super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_Eigen::Dense>).
               super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_0>.
               m_data;
      *(double *)((long)pdVar2 + lVar7 * 8 + lVar8) =
           *(double *)((long)pdVar2 + lVar7 * 8 + lVar8) / (src->m_functor).m_other;
    }
    lVar5 = lVar5 + 8;
  }
  return;
}

Assistant:

inline Index rows() const { return m_matrix.rows(); }